

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  TestPartResult *pTVar5;
  AssertionResult *pAVar6;
  char *pcVar7;
  int index;
  undefined1 local_78 [8];
  string expected;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Message msg;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar7 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  local_78 = (undefined1  [8])&expected._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,pcVar7,pcVar7 + (ulong)(TVar1 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_38);
  if ((int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249 == 1) {
    pTVar5 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar5->type_ == TVar1) {
      pcVar7 = strstr((pTVar5->message_)._M_dataplus._M_p,(this->substr_)._M_dataplus._M_p);
      if (pcVar7 == (char *)0x0) {
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ = 0;
        pAVar6 = AssertionResult::operator<<
                           ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x1ca252);
        pAVar6 = AssertionResult::operator<<
                           (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_78);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [14])" containing \"");
        pAVar6 = AssertionResult::operator<<(pAVar6,&this->substr_);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [3])0x1cade7);
        pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
        pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
        AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
      }
      else {
        expected.field_2._M_local_buf[8] = '\x01';
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
      }
    }
    else {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = 0;
      pAVar6 = AssertionResult::operator<<
                         ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x1ca252);
      pAVar6 = AssertionResult::operator<<
                         (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [2])0x1ca9e8);
      pAVar6 = AssertionResult::operator<<(pAVar6,(char (*) [11])"  Actual:\n");
      pAVar6 = AssertionResult::operator<<(pAVar6,pTVar5);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),(char *)local_78,
               (long)expected._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10),"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)(local_38._M_head_impl + 0x10),
               (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_38._M_head_impl + 0x10)," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_38._M_head_impl + 0x10),"\n",1);
        pTVar5 = TestPartResultArray::GetTestPartResult(this_00,index);
        testing::operator<<((ostream *)(local_38._M_head_impl + 0x10),pTVar5);
        index = index + 1;
        iVar4 = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4);
      } while (SBORROW4(index,iVar4 * -0x49249249) != index + iVar4 * 0x49249249 < 0);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = 0;
    pAVar6 = AssertionResult::operator<<((AssertionResult *)&gtest_ar.message_,(Message *)&local_38)
    ;
    AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar6);
  }
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  if (local_78 != (undefined1  [8])&expected._M_string_length) {
    operator_delete((void *)local_78);
  }
  if (expected.field_2._M_local_buf[8] == '\0') {
    Message::Message((Message *)local_78);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O1/tests/googletest-prefix/src/googletest/googletest/src/gtest.cc"
               ,0x38b,pcVar7);
    AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,(Message *)local_78);
    AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_78 + 8))();
    }
  }
  uVar3 = gtest_ar._0_8_;
  if (gtest_ar._0_8_ != 0) {
    if (*(void **)gtest_ar._0_8_ != (void *)(gtest_ar._0_8_ + 0x10)) {
      operator_delete(*(void **)gtest_ar._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  pcVar2 = (this->substr_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->substr_).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}